

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

void If_DsdObjSort(If_DsdMan_t *pMan,Vec_Ptr_t *p,int *pLits,int nLits,int *pPerm)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (1 < nLits) {
    uVar6 = 1;
    uVar2 = 0;
    do {
      uVar3 = uVar2 + 1;
      uVar5 = uVar2 & 0xffffffff;
      uVar7 = uVar6;
      do {
        iVar1 = If_DsdObjCompare(pMan,p,pLits[(int)(uint)uVar5],pLits[uVar7]);
        uVar4 = (uint)uVar7;
        if (iVar1 != 1) {
          uVar4 = (uint)uVar5;
        }
        uVar7 = uVar7 + 1;
        uVar5 = (ulong)uVar4;
      } while ((uint)nLits != uVar7);
      if (uVar2 != uVar4) {
        iVar1 = pLits[uVar2];
        pLits[uVar2] = pLits[(int)uVar4];
        pLits[(int)uVar4] = iVar1;
        if (pPerm != (int *)0x0) {
          iVar1 = pPerm[uVar2];
          pPerm[uVar2] = pPerm[(int)uVar4];
          pPerm[(int)uVar4] = iVar1;
        }
      }
      uVar6 = uVar6 + 1;
      uVar2 = uVar3;
    } while (uVar3 != nLits - 1);
  }
  return;
}

Assistant:

void If_DsdObjSort( If_DsdMan_t * pMan, Vec_Ptr_t * p, int * pLits, int nLits, int * pPerm )
{
    int i, j, best_i;
    for ( i = 0; i < nLits-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < nLits; j++ )
            if ( If_DsdObjCompare(pMan, p, pLits[best_i], pLits[j]) == 1 )
                best_i = j;
        if ( i == best_i )
            continue;
        ABC_SWAP( int, pLits[i], pLits[best_i] );
        if ( pPerm )
            ABC_SWAP( int, pPerm[i], pPerm[best_i] );
    }
}